

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string *name,bool expecting_enum)

{
  ulong uVar1;
  char *pcVar2;
  Tables *this_00;
  Symbol SVar3;
  string local_80 [48];
  undefined1 local_50 [8];
  string lookup_name;
  bool expecting_enum_local;
  string *name_local;
  DescriptorPool *this_local;
  Symbol result;
  
  lookup_name.field_2._M_local_buf[0xf] = expecting_enum;
  std::__cxx11::string::string((string *)local_50,(string *)name);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
    if (*pcVar2 == '.') {
      std::__cxx11::string::substr((ulong)local_80,(ulong)local_50);
      std::__cxx11::string::operator=((string *)local_50,local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                      (&this->tables_);
  SVar3 = Tables::FindByNameHelper(this_00,this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  SVar3._4_4_ = 0;
  return SVar3;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(const string& name,
                                               bool expecting_enum) const {
  string lookup_name = name;
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}